

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::LogFormat::updateFormatSpec(LogFormat *this)

{
  undefined *puVar1;
  char *pcVar2;
  bool bVar3;
  long in_RDI;
  FormatFlags in_stack_fffffffffffff8cc;
  LogFormat *in_stack_fffffffffffff8d0;
  string_t *in_stack_fffffffffffff8f0;
  string_t *in_stack_fffffffffffff8f8;
  string_t *in_stack_fffffffffffff900;
  allocator local_4c1;
  string local_4c0 [39];
  undefined1 local_499 [40];
  allocator local_471;
  string local_470 [39];
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [39];
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  puVar1 = consts::kSeverityLevelFormatSpecifier;
  if (*(int *)(in_RDI + 8) == 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,puVar1,&local_29);
    puVar1 = consts::kDebugLevelLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,puVar1,&local_61);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    puVar1 = consts::kSeverityLevelShortFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,puVar1,&local_89);
    pcVar2 = consts::kDebugLevelShortLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar2,&local_b1);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  else if (*(int *)(in_RDI + 8) == 0x80) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,puVar1,&local_d9);
    puVar1 = consts::kInfoLevelLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,puVar1,&local_101);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    puVar1 = consts::kSeverityLevelShortFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,puVar1,&local_129);
    puVar1 = consts::kInfoLevelShortLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,puVar1,&local_151);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
  }
  else if (*(int *)(in_RDI + 8) == 0x20) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,puVar1,&local_179);
    puVar1 = consts::kWarningLevelLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,puVar1,&local_1a1);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    puVar1 = consts::kSeverityLevelShortFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,puVar1,&local_1c9);
    puVar1 = consts::kWarningLevelShortLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f0,puVar1,&local_1f1);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  }
  else if (*(int *)(in_RDI + 8) == 0x10) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_218,puVar1,&local_219);
    pcVar2 = consts::kErrorLevelLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,pcVar2,&local_241);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    puVar1 = consts::kSeverityLevelShortFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_268,puVar1,&local_269);
    pcVar2 = consts::kErrorLevelShortLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_290,pcVar2,&local_291);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    std::__cxx11::string::~string(local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    std::__cxx11::string::~string(local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
  }
  else if (*(int *)(in_RDI + 8) == 8) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b8,puVar1,&local_2b9);
    puVar1 = consts::kFatalLevelLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e0,puVar1,&local_2e1);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    std::__cxx11::string::~string(local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    puVar1 = consts::kSeverityLevelShortFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_308,puVar1,&local_309);
    pcVar2 = consts::kFatalLevelShortLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,pcVar2,&local_331);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    std::__cxx11::string::~string(local_308);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
  }
  else if (*(int *)(in_RDI + 8) == 0x40) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_358,puVar1,&local_359);
    pcVar2 = consts::kVerboseLevelLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_380,pcVar2,&local_381);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    std::__cxx11::string::~string(local_380);
    std::allocator<char>::~allocator((allocator<char> *)&local_381);
    std::__cxx11::string::~string(local_358);
    std::allocator<char>::~allocator((allocator<char> *)&local_359);
    puVar1 = consts::kSeverityLevelShortFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3a8,puVar1,&local_3a9);
    pcVar2 = consts::kVerboseLevelShortLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3d0,pcVar2,&local_3d1);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    std::__cxx11::string::~string(local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    std::__cxx11::string::~string(local_3a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  }
  else if (*(int *)(in_RDI + 8) == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f8,puVar1,&local_3f9);
    puVar1 = consts::kTraceLevelLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_420,puVar1,&local_421);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    std::__cxx11::string::~string(local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    puVar1 = consts::kSeverityLevelShortFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_448,puVar1,&local_449);
    in_stack_fffffffffffff900 = consts::kTraceLevelShortLogValue;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_470,(char *)in_stack_fffffffffffff900,&local_471);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    std::__cxx11::string::~string(local_470);
    std::allocator<char>::~allocator((allocator<char> *)&local_471);
    std::__cxx11::string::~string(local_448);
    std::allocator<char>::~allocator((allocator<char> *)&local_449);
  }
  bVar3 = hasFlag(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc);
  if (bVar3) {
    in_stack_fffffffffffff8f8 = (string_t *)local_499;
    in_stack_fffffffffffff8f0 = (string_t *)consts::kCurrentUserFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_499 + 1),(char *)in_stack_fffffffffffff8f0,
               (allocator *)in_stack_fffffffffffff8f8);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    std::__cxx11::string::~string((string *)(local_499 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_499);
  }
  bVar3 = hasFlag(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc);
  puVar1 = consts::kCurrentHostFormatSpecifier;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c0,puVar1,&local_4c1);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    std::__cxx11::string::~string(local_4c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  }
  return;
}

Assistant:

void LogFormat::updateFormatSpec(void) {
  // Do not use switch over strongly typed enums because Intel C++ compilers dont support them yet.
  if (m_level == Level::Debug) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kDebugLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kDebugLevelShortLogValue);
  } else if (m_level == Level::Info) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kInfoLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kInfoLevelShortLogValue);
  } else if (m_level == Level::Warning) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kWarningLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kWarningLevelShortLogValue);
  } else if (m_level == Level::Error) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kErrorLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kErrorLevelShortLogValue);
  } else if (m_level == Level::Fatal) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kFatalLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kFatalLevelShortLogValue);
  } else if (m_level == Level::Verbose) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kVerboseLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kVerboseLevelShortLogValue);
  } else if (m_level == Level::Trace) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelFormatSpecifier,
        base::consts::kTraceLevelLogValue);
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kSeverityLevelShortFormatSpecifier,
        base::consts::kTraceLevelShortLogValue);
  }
  if (hasFlag(base::FormatFlags::User)) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kCurrentUserFormatSpecifier,
        m_currentUser);
  }
  if (hasFlag(base::FormatFlags::Host)) {
    base::utils::Str::replaceFirstWithEscape(m_format, base::consts::kCurrentHostFormatSpecifier,
        m_currentHost);
  }
  // Ignore Level::Global and Level::Unknown
}